

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScannerException.cpp
# Opt level: O2

void __thiscall ScannerException::ScannerException(ScannerException *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"scanner error",&local_31);
  ANTLRException::ANTLRException(&this->super_ANTLRException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_ANTLRException = &PTR__ANTLRException_00213c20;
  return;
}

Assistant:

ScannerException::ScannerException()
: ANTLRException("scanner error")
{}